

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_type_safe::object_ref<debugger_type,_false>_&,_const_debugger_type_&> * __thiscall
Catch::ExprLhs<type_safe::object_ref<debugger_type,false>const&>::operator!=
          (BinaryExpr<const_type_safe::object_ref<debugger_type,_false>_&,_const_debugger_type_&>
           *__return_storage_ptr__,ExprLhs<type_safe::object_ref<debugger_type,false>const&> *this,
          debugger_type *rhs)

{
  object_ref<debugger_type,_false> *poVar1;
  debugger_type *pdVar2;
  StringRef local_38;
  
  poVar1 = *(object_ref<debugger_type,_false> **)this;
  pdVar2 = poVar1->ptr_;
  StringRef::StringRef(&local_38,"!=");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = pdVar2 != rhs;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0021e090;
  __return_storage_ptr__->m_lhs = poVar1;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator != ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareNotEqual( m_lhs, rhs ), m_lhs, "!=", rhs };
        }